

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O3

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoinsMinConf
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,int64_t *target_value,vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          bool consider_fee,int64_t *select_value,Amount *utxo_fee_value,bool *searched_bnb)

{
  pointer pUVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int64_t iVar7;
  CfdException *this_00;
  ulong uVar8;
  long lVar9;
  pointer __args;
  Utxo *pUVar10;
  bool ignore_error;
  Utxo **utxo;
  pointer ppUVar11;
  ulong uVar12;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr___00;
  Amount AVar13;
  FeeCalculator effective_fee;
  undefined1 local_e8 [8];
  iterator iStack_e0;
  Utxo **local_d8;
  uint64_t local_d0;
  undefined1 local_c8 [8];
  int local_c0;
  char *local_b8 [2];
  FeeCalculator long_term_fee;
  FeeCalculator discard_fee;
  Amount local_90;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_80;
  long *local_78;
  int64_t search_value;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> work_utxos;
  long local_40;
  int64_t find_value;
  
  local_78 = target_value;
  if (select_value == (int64_t *)0x0) {
    local_c8 = (undefined1  [8])0x5dea9e;
    local_c0 = 0x1cd;
    local_b8[0] = "SelectCoinsMinConf";
    work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)filter;
    core::logger::log<void_const*&>
              ((CfdSourceLocation *)local_c8,kCfdLogLevelInfo,"select_value=null, filter={}",
               (void **)&work_utxos);
  }
  else {
    *select_value = 0;
  }
  if (searched_bnb != (bool *)0x0) {
    *searched_bnb = false;
  }
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector(&work_utxos,utxos);
  FeeCalculator::FeeCalculator(&effective_fee,option_params->effective_fee_baserate_);
  FeeCalculator::FeeCalculator(&discard_fee,10000);
  AVar13 = core::Amount::CreateBySatoshiAmount(0);
  local_90.amount_ = AVar13.amount_;
  local_90.ignore_check_ = AVar13.ignore_check_;
  local_d0 = option_params->effective_fee_baserate_;
  if (local_d0 != 0) {
    AVar13 = FeeCalculator::GetFee(&discard_fee,option_params->change_spend_size_);
    local_c8 = (undefined1  [8])AVar13.amount_;
    local_c0 = CONCAT31(local_c0._1_3_,AVar13.ignore_check_);
    AVar13 = FeeCalculator::GetFee(&effective_fee,option_params->change_output_size_);
    local_e8 = (undefined1  [8])AVar13.amount_;
    iStack_e0._M_current._0_1_ = AVar13.ignore_check_;
    AVar13 = core::operator+((Amount *)local_c8,(Amount *)local_e8);
    local_90.amount_ = AVar13.amount_;
    local_90.ignore_check_ = AVar13.ignore_check_;
  }
  local_e8 = (undefined1  [8])0x0;
  iStack_e0._M_current = (Utxo **)0x0;
  local_d8 = (Utxo **)0x0;
  local_80 = __return_storage_ptr__;
  if ((this->use_bnb_ != true) || (option_params->use_bnb_ != true)) goto LAB_003acae2;
  FeeCalculator::FeeCalculator(&long_term_fee,option_params->long_term_fee_baserate_);
  ppUVar11 = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ignore_error = false;
  for (__args = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                super__Vector_impl_data._M_start; __args != ppUVar11; __args = __args + 1) {
    pUVar10 = *__args;
    bVar3 = ignore_error;
    if (pUVar10 != (Utxo *)0x0) {
      pUVar10->effective_value = 0;
      pUVar10->fee = 0;
      pUVar10->long_term_fee = 0;
      AVar13 = FeeCalculator::GetFee(&effective_fee,pUVar10);
      local_c8 = (undefined1  [8])AVar13.amount_;
      local_c0 = CONCAT31(local_c0._1_3_,AVar13.ignore_check_);
      uVar4 = core::Amount::GetSatoshiValue((Amount *)local_c8);
      pUVar10 = *__args;
      uVar12 = pUVar10->amount;
      bVar3 = true;
      if (!consider_fee || uVar4 < uVar12) {
        if (local_d0 != 0) {
          uVar8 = uVar4;
          if (!consider_fee) {
            uVar8 = 0;
          }
          pUVar10->fee = uVar4;
          AVar13 = FeeCalculator::GetFee(&long_term_fee,pUVar10);
          local_c8 = (undefined1  [8])AVar13.amount_;
          local_c0 = CONCAT31(local_c0._1_3_,AVar13.ignore_check_);
          uVar5 = core::Amount::GetSatoshiValue((Amount *)local_c8);
          uVar12 = uVar12 - uVar8;
          (*__args)->long_term_fee = uVar5;
          pUVar10 = *__args;
        }
        if (pUVar10->fee < pUVar10->long_term_fee) {
          pUVar10->long_term_fee = pUVar10->fee;
        }
        pUVar10->effective_value = uVar12;
        pUVar10->effective_k_value = uVar12;
        if (iStack_e0._M_current == local_d8) {
          std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*const&>
                    ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)local_e8,iStack_e0,__args);
          bVar3 = ignore_error;
        }
        else {
          *iStack_e0._M_current = pUVar10;
          iStack_e0._M_current = iStack_e0._M_current + 1;
          bVar3 = ignore_error;
        }
      }
    }
    ignore_error = bVar3;
  }
  local_c8 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_90);
  __return_storage_ptr___00 = local_80;
  SelectCoinsBnB(local_80,(CoinSelection *)select_value,local_78,
                 (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_e8,(int64_t *)local_c8,
                 tx_fee_value,ignore_error,select_value,utxo_fee_value);
  pUVar1 = (__return_storage_ptr___00->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pUVar1 != (__return_storage_ptr___00->
                super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    if (searched_bnb != (bool *)0x0) {
      *searched_bnb = true;
    }
    goto LAB_003accb5;
  }
  if (pUVar1 != (pointer)0x0) {
    operator_delete(pUVar1);
  }
  if (local_e8 == (undefined1  [8])iStack_e0._M_current) {
LAB_003acae2:
    uVar5 = local_d0;
    if (work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppUVar11 = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        pUVar10 = *ppUVar11;
        if (pUVar10 != (Utxo *)0x0) {
          if (uVar5 == 0) {
            uVar6 = 0;
          }
          else {
            AVar13 = FeeCalculator::GetFee(&effective_fee,pUVar10);
            local_c8 = (undefined1  [8])AVar13.amount_;
            local_c0 = CONCAT31(local_c0._1_3_,AVar13.ignore_check_);
            uVar6 = core::Amount::GetSatoshiValue((Amount *)local_c8);
            pUVar10 = *ppUVar11;
          }
          pUVar10->fee = uVar6;
          pUVar10 = *ppUVar11;
          pUVar10->effective_k_value = pUVar10->amount;
          if (consider_fee) {
            pUVar10->effective_k_value = pUVar10->amount - pUVar10->fee;
          }
          if (iStack_e0._M_current == local_d8) {
            std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*const&>
                      ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)local_e8,iStack_e0,ppUVar11)
            ;
          }
          else {
            *iStack_e0._M_current = pUVar10;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
        }
        ppUVar11 = ppUVar11 + 1;
      } while (ppUVar11 !=
               work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else if (ignore_error != false) {
    iStack_e0._M_current = (Utxo **)local_e8;
    goto LAB_003acae2;
  }
  lVar9 = *local_78;
  search_value = lVar9;
  AVar13 = core::Amount::CreateBySatoshiAmount(0);
  __return_storage_ptr___00 = local_80;
  _long_term_fee = AVar13.amount_;
  iVar7 = core::Amount::GetSatoshiValue(tx_fee_value);
  if (0 < iVar7) {
    iVar7 = core::Amount::GetSatoshiValue(tx_fee_value);
    lVar9 = lVar9 + iVar7;
    search_value = lVar9;
  }
  uVar5 = option_params->knapsack_minimum_change_;
  uVar6 = 1000000;
  if (-1 < (long)uVar5) {
    uVar6 = uVar5;
  }
  if ((-1 < (long)uVar5 && local_d0 != 0) &&
     (iVar7 = core::Amount::GetSatoshiValue(&local_90), uVar6 = uVar5, (long)uVar5 <= iVar7)) {
    uVar6 = core::Amount::GetSatoshiValue(&local_90);
  }
  KnapsackSolver(__return_storage_ptr___00,this,&search_value,
                 (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_e8,uVar6,select_value,
                 (Amount *)&long_term_fee);
  if (local_d0 != 0) {
    lVar2 = *select_value;
    find_value = lVar2;
    iVar7 = core::Amount::GetSatoshiValue((Amount *)&long_term_fee);
    local_40 = lVar9 + iVar7;
    if (lVar2 < local_40) {
      local_c8 = (undefined1  [8])0x5dea9e;
      local_c0 = 0x243;
      local_b8[0] = "SelectCoinsMinConf";
      core::logger::log<long&,long&>
                ((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                 "Failed to KnapsackSolver. Not enough utxos.: find_value={}, need_value={}",
                 &find_value,&local_40);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8 = (undefined1  [8])local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"Failed to KnapsackSolver. Not enough utxos.","");
      core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_c8);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if (utxo_fee_value != (Amount *)0x0) {
    utxo_fee_value->ignore_check_ = AVar13.ignore_check_;
    utxo_fee_value->amount_ = _long_term_fee;
  }
LAB_003accb5:
  if (local_e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e8);
  }
  if (work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoinsMinConf(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, const bool consider_fee, int64_t* select_value,
    Amount* utxo_fee_value, bool* searched_bnb) {
  // for btc default(DUST_RELAY_TX_FEE(3000)) -> DEFAULT_DISCARD_FEE(10000)
  if (select_value != nullptr) {
    *select_value = 0;
  } else {
    cfd::core::logger::info(
        CFD_LOG_SOURCE, "select_value=null, filter={}",
        static_cast<const void*>(&filter));
    // for unused parameter
  }
  if (searched_bnb != nullptr) *searched_bnb = false;

  // Copy the list to change the calculation area.
  std::vector<Utxo*> work_utxos = utxos;
  FeeCalculator effective_fee(option_params.GetEffectiveFeeBaserate());
  FeeCalculator discard_fee(kDefaultDiscardFee);
  Amount cost_of_change = Amount::CreateBySatoshiAmount(0);
  bool use_fee = false;
  if (option_params.GetEffectiveFeeBaserate() != 0) {
    cost_of_change = discard_fee.GetFee(option_params.GetChangeSpendSize()) +
                     effective_fee.GetFee(option_params.GetChangeOutputSize());
    use_fee = true;
  }

  std::vector<Utxo*> utxo_pool;
  bool ignore_error = false;
  if (use_bnb_ && option_params.IsUseBnB()) {
    // Get long term estimate
    FeeCalculator long_term_fee(option_params.GetLongTermFeeBaserate());

    // NOLINT Filter by the min conf specs and add to utxo_pool and calculate effective value
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      // if (!group.EligibleForSpending(eligibility_filter)) continue;
      utxo->fee = 0;
      utxo->long_term_fee = 0;
      utxo->effective_value = 0;

      uint64_t fee = effective_fee.GetFee(*utxo).GetSatoshiValue();
      // Only include outputs that are positive effective value (i.e. not dust)
      if ((utxo->amount > fee) || (!consider_fee)) {
        uint64_t effective_value = utxo->amount;
        if (use_fee) {
          if (consider_fee) {
            effective_value -= fee;
          }
          utxo->fee = fee;
          utxo->long_term_fee = long_term_fee.GetFee(*utxo).GetSatoshiValue();
        }
#if 0
        std::vector<uint8_t> txid_byte(sizeof(utxo->txid));
        memcpy(txid_byte.data(), utxo->txid, txid_byte.size());
        info(
            CFD_LOG_SOURCE, "utxo({},{}) size={}/{} amount={}/{}/{}",
            Txid(txid_byte).GetHex(), utxo->vout, utxo->uscript_size_max,
            utxo->witness_size_max, utxo->amount, utxo->fee,
            utxo->long_term_fee);
#endif
        if (utxo->long_term_fee > utxo->fee) {
          utxo->long_term_fee = utxo->fee;  // TODO(k-matsuzawa): Check later
        }
        utxo->effective_value = effective_value;
        utxo->effective_k_value = static_cast<int64_t>(effective_value);
        utxo_pool.push_back(utxo);
      } else {
        ignore_error = true;
      }
    }
    // Calculate the fees for things that aren't inputs
    std::vector<Utxo> result = SelectCoinsBnB(
        target_value, utxo_pool, cost_of_change.GetSatoshiValue(),
        tx_fee_value, ignore_error, select_value, utxo_fee_value);
    if (!result.empty()) {
      if (searched_bnb) *searched_bnb = true;
      return result;
    }
    // SelectCoinsBnB fail, go to KnapsackSolver.
  }

  // Filter by the min conf specs and add to utxo_pool
  // TODO(k-matsuzawa): Currently it is not filtered, so there is no need to recreate the Utxo list.  // NOLINT
  // for (const OutputGroup& group : groups) {
  //   if (!group.EligibleForSpending(eligibility_filter)) continue;
  //   utxo_pool.push_back(group);
  // }
  if (utxo_pool.empty() || ignore_error) {
    utxo_pool.clear();
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      utxo->fee =
          (use_fee) ? effective_fee.GetFee(*utxo).GetSatoshiValue() : 0;
      utxo->effective_k_value = static_cast<int64_t>(utxo->amount);
      if (consider_fee) {
        utxo->effective_k_value -= static_cast<int64_t>(utxo->fee);
      }
      utxo_pool.push_back(utxo);
    }
  }
  int64_t search_value = target_value;
  Amount utxo_fee = Amount::CreateBySatoshiAmount(0);
  if (tx_fee_value.GetSatoshiValue() > 0) {
    search_value += tx_fee_value.GetSatoshiValue();
  }

  // using minimum fee
  uint64_t min_change = kMinChange;
  int64_t opt_min_change = option_params.GetKnapsackMinimumChange();
  if (opt_min_change >= 0) {
    if ((!use_fee) || (opt_min_change > cost_of_change.GetSatoshiValue())) {
      min_change = static_cast<uint64_t>(opt_min_change);
    } else if (use_fee) {
      min_change = static_cast<uint64_t>(cost_of_change.GetSatoshiValue());
    }
  }
  std::vector<Utxo> result = KnapsackSolver(
      search_value, utxo_pool, min_change, select_value, &utxo_fee);
  if (use_fee) {
    // Check if the required amount was detected
    // (May be a non-passing route)
    int64_t find_value = *select_value;
    int64_t need_value = search_value;
    need_value += utxo_fee.GetSatoshiValue();
    if (need_value > find_value) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to KnapsackSolver. Not enough utxos."
          ": find_value={}, need_value={}",
          find_value, need_value);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to KnapsackSolver. Not enough utxos.");
    }
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee;
  }
  return result;
}